

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O1

void movePack_print_json(MovePack *movePack)

{
  byte bVar1;
  ulong uVar2;
  
  putchar(0x5b);
  if (movePack->movesCount != 0) {
    bVar1 = 1;
    uVar2 = 0;
    do {
      if (bVar1 != 1) {
        putchar(0x2c);
      }
      move_print_json(movePack->moves[uVar2]);
      uVar2 = (ulong)bVar1;
      bVar1 = bVar1 + 1;
    } while (uVar2 < movePack->movesCount);
  }
  putchar(0x5d);
  return;
}

Assistant:

void movePack_print_json(MovePack * movePack)
{
	unsigned char i;
	printf("[");
	for(i=0;i<movePack->movesCount;i++)
	{
		if(i>0)
			printf(",");
		move_print_json(movePack->moves[i]);
	}
	printf("]");
}